

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void boost::throw_exception<boost::asio::invalid_service_owner>(invalid_service_owner *e)

{
  error_info_injector<boost::asio::invalid_service_owner> *x;
  exception *in_RDI;
  
  throw_exception_assert_compatibility(in_RDI);
  x = (error_info_injector<boost::asio::invalid_service_owner> *)__cxa_allocate_exception(0x40);
  enable_error_info<boost::asio::invalid_service_owner>((invalid_service_owner *)x);
  enable_current_exception<boost::exception_detail::error_info_injector<boost::asio::invalid_service_owner>>
            (x);
  __cxa_throw(x,&exception_detail::
                 clone_impl<boost::exception_detail::error_info_injector<boost::asio::invalid_service_owner>>
                 ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::asio::invalid_service_owner>_>
              ::~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}